

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

set<int,_std::less<int>,_std::allocator<int>_> *
wallet::InterpretSubtractFeeFromOutputInstructions
          (UniValue *sffo_instructions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *destinations)

{
  long lVar1;
  bool bVar2;
  __type_conflict _Var3;
  undefined1 uVar4;
  int iVar5;
  char *fmt;
  int *args;
  size_type sVar6;
  undefined8 uVar7;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  size_t i;
  UniValue *sffo;
  vector<UniValue,_std::allocator<UniValue>_> *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> *sffo_set;
  int pos;
  const_iterator __end1;
  const_iterator __begin1;
  UniValue *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  UniValue *in_stack_fffffffffffffe88;
  int iVar9;
  undefined2 in_stack_fffffffffffffe9c;
  undefined1 in_stack_fffffffffffffe9f;
  const_reference in_stack_fffffffffffffea8;
  int iVar10;
  UniValue *in_stack_fffffffffffffeb0;
  ulong local_100;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffe58);
  bVar2 = UniValue::isNull(in_stack_fffffffffffffe58);
  if (!bVar2) {
    bVar2 = UniValue::isBool(in_stack_fffffffffffffe58);
    if (bVar2) {
      bVar2 = UniValue::get_bool((UniValue *)
                                 CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      if (bVar2) {
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   in_stack_fffffffffffffe68._M_node,
                   (value_type_conflict4 *)
                   CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      }
    }
    else {
      UniValue::getValues(in_stack_fffffffffffffe88);
      std::vector<UniValue,_std::allocator<UniValue>_>::begin
                ((vector<UniValue,_std::allocator<UniValue>_> *)
                 CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      std::vector<UniValue,_std::allocator<UniValue>_>::end
                ((vector<UniValue,_std::allocator<UniValue>_> *)
                 CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      while (bVar2 = __gnu_cxx::
                     operator==<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                               ((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                                 *)in_stack_fffffffffffffe68._M_node,
                                (__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60)),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
        operator*((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                   *)in_stack_fffffffffffffe58);
        bVar2 = UniValue::isStr(in_stack_fffffffffffffe58);
        if (bVar2) {
          for (local_100 = 0;
              sVar6 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffffe58), local_100 < sVar6;
              local_100 = local_100 + 1) {
            in_stack_fffffffffffffeb0 =
                 (UniValue *)
                 UniValue::get_str_abi_cxx11_
                           ((UniValue *)
                            CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
            in_stack_fffffffffffffea8 =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffe68._M_node,
                      CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
            _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
            if (_Var3) {
              pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                 in_stack_fffffffffffffe68._M_node,
                                 (value_type_conflict4 *)
                                 CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
              in_stack_fffffffffffffe9f = pVar8.second;
              break;
            }
          }
        }
        uVar4 = UniValue::isNum(in_stack_fffffffffffffe58);
        if ((bool)uVar4) {
          iVar5 = UniValue::getInt<int>(in_stack_fffffffffffffeb0);
          iVar9 = iVar5;
          bVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::contains
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             in_stack_fffffffffffffe68._M_node,
                             (key_type_conflict2 *)
                             CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
          iVar10 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
          if (bVar2) {
            fmt = (char *)__cxa_allocate_exception(0x58);
            tinyformat::format<int>(fmt,(int *)in_stack_fffffffffffffe80);
            JSONRPCError(iVar10,(string *)
                                CONCAT17(in_stack_fffffffffffffe9f,
                                         CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffffe9c,iVar9))))
            ;
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(fmt,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_00c7cdeb;
          }
          if (iVar5 < 0) {
            args = (int *)__cxa_allocate_exception(0x58);
            tinyformat::format<int>((char *)in_stack_fffffffffffffe88,args);
            JSONRPCError(iVar10,(string *)
                                CONCAT17(in_stack_fffffffffffffe9f,
                                         CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffffe9c,iVar9))))
            ;
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(args,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_00c7cdeb;
          }
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffe58);
          iVar10 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
          if ((int)sVar6 <= iVar5) {
            uVar7 = __cxa_allocate_exception(0x58);
            tinyformat::format<int>
                      ((char *)in_stack_fffffffffffffe88,(int *)in_stack_fffffffffffffe80);
            JSONRPCError(iVar10,(string *)
                                CONCAT17(in_stack_fffffffffffffe9f,
                                         CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffffe9c,iVar9))))
            ;
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(uVar7,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_00c7cdeb;
          }
          pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             in_stack_fffffffffffffe68._M_node,
                             (value_type_conflict4 *)
                             CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
          in_stack_fffffffffffffe68 = pVar8.first._M_node;
          in_stack_fffffffffffffe67 = pVar8.second;
        }
        __gnu_cxx::
        __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
        operator++((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                    *)in_stack_fffffffffffffe58);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
LAB_00c7cdeb:
  __stack_chk_fail();
}

Assistant:

std::set<int> InterpretSubtractFeeFromOutputInstructions(const UniValue& sffo_instructions, const std::vector<std::string>& destinations)
{
    std::set<int> sffo_set;
    if (sffo_instructions.isNull()) return sffo_set;
    if (sffo_instructions.isBool()) {
        if (sffo_instructions.get_bool()) sffo_set.insert(0);
        return sffo_set;
    }
    for (const auto& sffo : sffo_instructions.getValues()) {
        if (sffo.isStr()) {
            for (size_t i = 0; i < destinations.size(); ++i) {
                if (sffo.get_str() == destinations.at(i)) {
                    sffo_set.insert(i);
                    break;
                }
            }
        }
        if (sffo.isNum()) {
            int pos = sffo.getInt<int>();
            if (sffo_set.contains(pos))
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, duplicated position: %d", pos));
            if (pos < 0)
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, negative position: %d", pos));
            if (pos >= int(destinations.size()))
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, position too large: %d", pos));
            sffo_set.insert(pos);
        }
    }
    return sffo_set;
}